

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

bool anon_unknown.dwarf_54919::SetVoiceOffset
               (Voice *oldvoice,VoicePos *vpos,ALsource *source,ALCcontext *context,
               ALCdevice *device)

{
  VoiceChange *pVVar1;
  __int_type_conflict2 _Var2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  BufferlistItem *BufferList;
  ulong uVar7;
  VoiceChange *tail;
  element_type voice;
  
  _Var2 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
  if (_Var2 != 0) {
    lVar5 = _Var2 * 8;
    uVar7 = 0;
    do {
      voice = (&((context->mVoices)._M_b._M_p)->field_1)[uVar7].mArray[0];
      if ((((voice->mPlayState)._M_i == Stopped) &&
          ((voice->mSourceID).super___atomic_base<unsigned_int>._M_i == 0)) &&
         (((voice->mPendingChange)._M_base._M_i & 1U) == 0)) goto LAB_001298cf;
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  if (((context->mVoices)._M_b._M_p)->mSize == _Var2) {
    ALCcontext::allocVoices(context,1);
  }
  LOCK();
  (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i =
       (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  _Var2 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
  if (_Var2 == 0) {
    uVar7 = 0;
  }
  else {
    lVar5 = _Var2 * 8;
    uVar7 = (ulong)((int)(lVar5 + 0x7fffffff8U >> 3) + 1);
    uVar6 = 0;
    do {
      voice = (&((context->mVoices)._M_b._M_p)->field_1)[uVar6].mArray[0];
      if ((((voice->mPlayState)._M_i == Stopped) &&
          ((voice->mSourceID).super___atomic_base<unsigned_int>._M_i == 0)) &&
         (((voice->mPendingChange)._M_base._M_i & 1U) == 0)) {
        uVar7 = uVar6 & 0xffffffff;
        goto LAB_001298cf;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  voice = (Voice *)0x0;
LAB_001298cf:
  (voice->mPlayState)._M_i = Pending;
  (voice->mPosition).super___atomic_base<unsigned_int>._M_i = vpos->pos;
  (voice->mPositionFrac).super___atomic_base<unsigned_int>._M_i = vpos->frac;
  (voice->mCurrentBuffer)._M_b._M_p = vpos->bufferitem;
  if (vpos->frac == 0 && vpos->pos == 0) {
    BufferList = source->queue;
    uVar4 = (uint)(vpos->bufferitem != BufferList) << 4;
  }
  else {
    BufferList = source->queue;
    uVar4 = 0x10;
  }
  voice->mFlags = uVar4;
  InitVoice(voice,source,BufferList,context,device);
  source->VoiceIdx = (ALuint)uVar7;
  (oldvoice->mPendingChange)._M_base._M_i = true;
  tail = context->mVoiceChangeTail;
  if (tail == (context->mCurrentVoiceChange)._M_b._M_p) {
    ALCcontext::allocVoiceChanges(context,1);
    tail = context->mVoiceChangeTail;
  }
  LOCK();
  pVVar1 = (tail->mNext)._M_b._M_p;
  (tail->mNext)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  context->mVoiceChangeTail = pVVar1;
  tail->mOldVoice = oldvoice;
  tail->mVoice = voice;
  tail->mSourceID = source->id;
  tail->mState = 0x1025;
  SendVoiceChanges(context,tail);
  bVar3 = true;
  if (((oldvoice->mSourceID).super___atomic_base<unsigned_int>._M_i == 0) &&
     ((voice->mPlayState)._M_i == Pending)) {
    do {
    } while (((device->MixCount).super___atomic_base<unsigned_int>._M_i & 1) != 0);
    if ((voice->mPlayState)._M_i == Pending) {
      (voice->mCurrentBuffer)._M_b._M_p = (__pointer_type)0x0;
      (voice->mLoopBuffer)._M_b._M_p = (__pointer_type)0x0;
      (voice->mSourceID).super___atomic_base<unsigned_int>._M_i = 0;
      (voice->mPlayState)._M_i = Stopped;
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SetVoiceOffset(Voice *oldvoice, const VoicePos &vpos, ALsource *source, ALCcontext *context,
    ALCdevice *device)
{
    /* First, get a free voice to start at the new offset. */
    auto voicelist = context->getVoicesSpan();
    Voice *newvoice{};
    ALuint vidx{0};
    for(Voice *voice : voicelist)
    {
        if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
            && voice->mSourceID.load(std::memory_order_relaxed) == 0u
            && voice->mPendingChange.load(std::memory_order_relaxed) == false)
        {
            newvoice = voice;
            break;
        }
        ++vidx;
    }
    if UNLIKELY(!newvoice)
    {
        auto &allvoices = *context->mVoices.load(std::memory_order_relaxed);
        if(allvoices.size() == voicelist.size())
            context->allocVoices(1);
        context->mActiveVoiceCount.fetch_add(1, std::memory_order_release);
        voicelist = context->getVoicesSpan();

        vidx = 0;
        for(Voice *voice : voicelist)
        {
            if(voice->mPlayState.load(std::memory_order_acquire) == Voice::Stopped
                && voice->mSourceID.load(std::memory_order_relaxed) == 0u
                && voice->mPendingChange.load(std::memory_order_relaxed) == false)
            {
                newvoice = voice;
                break;
            }
            ++vidx;
        }
    }